

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O0

void __thiscall
persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
::compute_higher_persistence
          (persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
           *this,unsigned_short min_dimension,unsigned_short max_dimension)

{
  bool bVar1;
  size_t sVar2;
  pair<float,_int> p;
  ostream *poVar3;
  void *this_00;
  pair<int,_int> pVar4;
  value_type_conflict4 *pvVar5;
  int iVar6;
  ushort in_DX;
  ushort in_SI;
  undefined8 *in_RDI;
  pair<int,_int> betti;
  pivot_column_index_t pivot_column_index;
  index_t index;
  index_t number_of_cells;
  uint dimension;
  int in_stack_0000020c;
  directed_flag_complex_in_memory_computer_t *in_stack_00000210;
  undefined1 in_stack_00000397;
  pivot_column_index_t *in_stack_00000398;
  index_t in_stack_000003a4;
  persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  *in_stack_000003a8;
  value_type *in_stack_fffffffffffffec8;
  directed_flag_complex_in_memory_computer_t *in_stack_fffffffffffffed0;
  directed_flag_complex_in_memory_computer_t *in_stack_fffffffffffffed8;
  ostream *in_stack_fffffffffffffee8;
  value_type_conflict4 *in_stack_fffffffffffffef0;
  ostream *in_stack_fffffffffffffef8;
  ostream *in_stack_ffffffffffffff00;
  ostream *in_stack_ffffffffffffff08;
  persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  *in_stack_ffffffffffffff10;
  persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  *in_stack_ffffffffffffff20;
  int local_9c;
  int iStack_98;
  filtration_index_t local_20;
  int local_18;
  int local_14;
  uint local_10;
  ushort local_c;
  ushort local_a;
  
  local_10 = 1;
  local_c = in_DX;
  local_a = in_SI;
  do {
    if (local_c < local_10) {
      return;
    }
    directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t::
    prepare_next_dimension(in_stack_00000210,in_stack_0000020c);
    if (local_10 + 1 == (uint)local_a) {
      sVar2 = directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t::
              number_of_cells(in_stack_fffffffffffffed0,
                              (int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
      local_14 = (int)sVar2;
      for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
        directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t::
        filtration(in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                   (index_t)in_stack_fffffffffffffed0);
        p = std::make_pair<float,int&>((float *)in_stack_fffffffffffffec8,(int *)0x1c0c8d);
        filtration_index_t::filtration_index_t(&local_20,p);
        std::deque<filtration_index_t,_std::allocator<filtration_index_t>_>::push_back
                  ((deque<filtration_index_t,_std::allocator<filtration_index_t>_> *)
                   in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      }
    }
    if ((uint)local_a <= local_10 + 1) {
      (**(code **)(*(long *)in_RDI[1] + 0x28))((long *)in_RDI[1],(undefined2)local_10);
      sort_columns(in_stack_ffffffffffffff20);
      poVar3 = std::operator<<((ostream *)&std::cout,"\x1b[K");
      poVar3 = std::operator<<(poVar3,"computing persistent homology in dimension ");
      this_00 = (void *)std::ostream::operator<<(poVar3,local_10);
      poVar3 = (ostream *)std::ostream::operator<<(this_00,std::flush<char,std::char_traits<char>>);
      std::operator<<(poVar3,"\r");
      directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t::
      number_of_cells(in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
      std::allocator<int>::allocator((allocator<int> *)0x1c0d98);
      std::deque<int,_std::allocator<int>_>::deque
                ((deque<int,_std::allocator<int>_> *)in_stack_ffffffffffffff00,
                 (size_type)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                 (allocator_type *)in_stack_fffffffffffffee8);
      std::allocator<int>::~allocator((allocator<int> *)0x1c0dc5);
      pVar4 = compute_pairs(in_stack_000003a8,in_stack_000003a4,in_stack_00000398,
                            (bool)in_stack_00000397);
      iStack_98 = pVar4.second;
      if (local_10 < local_a) {
        if ((local_10 == local_a - 1) && ((*(byte *)((long)in_RDI + 0x24) & 1) != 0)) {
          in_stack_fffffffffffffef0 = (value_type_conflict4 *)in_RDI[3];
          pvVar5 = (value_type_conflict4 *)std::numeric_limits<unsigned_long>::max();
          if (in_stack_fffffffffffffef0 < pvVar5) {
            in_stack_fffffffffffffee8 = std::operator<<((ostream *)&std::cout,"\x1b[K");
            poVar3 = std::operator<<(in_stack_fffffffffffffee8,"# Skipped columns in dimension ");
            in_stack_fffffffffffffed8 =
                 (directed_flag_complex_in_memory_computer_t *)
                 std::ostream::operator<<(poVar3,local_10);
            in_stack_fffffffffffffed0 =
                 (directed_flag_complex_in_memory_computer_t *)
                 std::operator<<((ostream *)in_stack_fffffffffffffed8,": ");
            in_stack_fffffffffffffec8 =
                 (value_type *)std::ostream::operator<<(in_stack_fffffffffffffed0,iStack_98);
            std::ostream::operator<<
                      (in_stack_fffffffffffffec8,std::endl<char,std::char_traits<char>>);
          }
        }
      }
      else {
        local_9c = pVar4.first;
        directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t::
        computation_result((directed_flag_complex_in_memory_computer_t *)*in_RDI,local_10,
                           (long)local_9c,(long)iStack_98);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffed0,(value_type_conflict3 *)in_stack_fffffffffffffec8);
        (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],(long)local_9c,(long)iStack_98);
        iVar6 = 1;
        if ((local_10 & 1) != 0) {
          iVar6 = -1;
        }
        *(int *)(in_RDI + 4) = iVar6 * local_9c + *(int *)(in_RDI + 4);
        if ((*(byte *)((long)in_RDI + 0x24) & 1) != 0) {
          in_stack_ffffffffffffff20 =
               (persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
                *)std::operator<<((ostream *)&std::cout,"\x1b[K");
          poVar3 = std::operator<<((ostream *)in_stack_ffffffffffffff20,"dim H_");
          in_stack_ffffffffffffff10 =
               (persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
                *)std::ostream::operator<<(poVar3,local_10);
          in_stack_ffffffffffffff08 = std::operator<<((ostream *)in_stack_ffffffffffffff10," = ");
          std::ostream::operator<<(in_stack_ffffffffffffff08,local_9c);
          if (0 < iStack_98) {
            in_stack_ffffffffffffff00 = std::operator<<((ostream *)&std::cout," (skipped ");
            in_stack_fffffffffffffef8 =
                 (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff00,iStack_98);
            std::operator<<(in_stack_fffffffffffffef8,")");
          }
          std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
        }
      }
      if (local_10 < local_c) {
        assemble_columns_to_reduce
                  (in_stack_ffffffffffffff10,(index_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                   (pivot_column_index_t *)in_stack_ffffffffffffff00);
      }
      bVar1 = directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t::
              is_top_dimension((directed_flag_complex_in_memory_computer_t *)*in_RDI);
      if (bVar1) {
        (**(code **)(*(long *)in_RDI[1] + 0x50))();
      }
      std::deque<int,_std::allocator<int>_>::~deque
                ((deque<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20);
      if (bVar1) {
        return;
      }
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

void compute_higher_persistence(unsigned short min_dimension, unsigned short max_dimension) {
		for (auto dimension = 1u; dimension <= max_dimension; ++dimension) {
			complex.prepare_next_dimension(dimension);

			if (dimension + 1 == min_dimension) {
				// Here we need to reduce *all* cells because we did not compute anything of smaller dimension
				index_t number_of_cells = index_t(complex.number_of_cells(dimension));
				for (index_t index = 0; index < number_of_cells; index++) {
					columns_to_reduce.push_back(std::make_pair(complex.filtration(dimension, index), index));
				}
			}

			if (dimension + 1 < min_dimension) continue;

			output->computing_barcodes_in_dimension(dimension);

			sort_columns();

#ifdef INDICATE_PROGRESS
			std::cout << "\033[K"
			          << "computing persistent homology in dimension " << dimension << std::flush << "\r";
#endif
#ifdef USE_ARRAY_HASHMAP
			pivot_column_index_t pivot_column_index(complex.number_of_cells(dimension + 1), INVALID_INDEX);
#else
			pivot_column_index_t pivot_column_index;
			pivot_column_index.reserve(complex.number_of_cells(dimension + 1));
#endif

			auto betti = compute_pairs(dimension, pivot_column_index, dimension >= min_dimension);
			if (dimension >= min_dimension) {
				complex.computation_result(dimension, betti.first, betti.second);
#ifdef RETRIEVE_PERSISTENCE
				betti_numbers.push_back(betti.first);
#endif
				output->betti_number(betti.first, betti.second);
				euler_characteristic += (dimension & 1 ? -1 : 1) * betti.first;

				if (print_betti_numbers_to_console) {
					std::cout << "\033[K"
					          << "dim H_" << dimension << " = " << betti.first;
					if (betti.second > 0) { std::cout << " (skipped " << betti.second << ")"; }
					std::cout << std::endl;
				}
			} else if (int(dimension) == min_dimension - 1 && print_betti_numbers_to_console &&
			           max_entries < std::numeric_limits<size_t>::max()) {
				std::cout << "\033[K"
				          << "# Skipped columns in dimension " << dimension << ": " << betti.second << std::endl;
			}
			if (dimension < max_dimension) assemble_columns_to_reduce(dimension, pivot_column_index);

			// Stop early
			if (complex.is_top_dimension()) {
				output->remaining_homology_is_trivial();
				break;
			}
		}
	}